

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_simple_elements
                 (lysp_yin_ctx *ctx,ly_stmt parent_stmt,char ***values,yin_argument arg_type,
                 yang_arg arg_val_type,lysp_ext_instance **exts)

{
  char **ppcVar1;
  LY_ERR LVar2;
  LY_ERR LVar3;
  long *plVar4;
  long lVar5;
  yin_subelement subelems [1];
  uint64_t index;
  yin_subelement local_58;
  char *local_38;
  
  ppcVar1 = *values;
  if (ppcVar1 == (char **)0x0) {
    local_58.dest = &local_38;
    local_38 = (char *)0x0;
    local_58.type = LY_STMT_EXTENSION_INSTANCE;
    local_58.flags = 0;
    plVar4 = (long *)malloc(0x10);
    if (plVar4 == (long *)0x0) goto LAB_00189cd4;
    *plVar4 = 1;
    lVar5 = 1;
  }
  else {
    local_38 = ppcVar1[-1];
    local_58.dest = &local_38;
    local_58.type = LY_STMT_EXTENSION_INSTANCE;
    local_58.flags = 0;
    ppcVar1[-1] = local_38 + 1;
    plVar4 = (long *)realloc(ppcVar1 + -1,(long)local_38 * 8 + 0x10);
    if (plVar4 == (long *)0x0) {
      (*values)[-1] = (*values)[-1] + -1;
LAB_00189cd4:
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_simple_elements");
      return LY_EMEM;
    }
    lVar5 = *plVar4;
  }
  *values = (char **)(plVar4 + 1);
  plVar4[lVar5] = 0;
  LVar2 = lyxml_ctx_next(ctx->xmlctx);
  if ((LVar2 == LY_SUCCESS) &&
     (LVar2 = yin_parse_attribute(ctx,arg_type,(char **)(plVar4 + lVar5),arg_val_type,parent_stmt),
     LVar2 == LY_SUCCESS)) {
    LVar3 = yin_parse_content(ctx,&local_58,1,*values,parent_stmt,(char **)0x0,exts);
    LVar2 = LVar3 + (LVar3 == LY_SUCCESS);
    if (LVar3 == LY_SUCCESS) {
      LVar2 = LY_SUCCESS;
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
yin_parse_simple_elements(struct lysp_yin_ctx *ctx, enum ly_stmt parent_stmt, const char ***values,
        enum yin_argument arg_type, enum yang_arg arg_val_type, struct lysp_ext_instance **exts)
{
    const char **value;
    LY_ARRAY_COUNT_TYPE index = LY_ARRAY_COUNT(*values);
    struct yin_subelement subelems[] = {
        {LY_STMT_EXTENSION_INSTANCE, &index, 0}
    };

    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *values, value, LY_EMEM);

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, arg_type, value, arg_val_type, parent_stmt));

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), *values, parent_stmt, NULL, exts));

    return LY_SUCCESS;
}